

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O2

int Aig_ObjCheckTfi(Aig_Man_t *p,Aig_Obj_t *pNew,Aig_Obj_t *pOld)

{
  int iVar1;
  
  if (((ulong)pNew & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRepr.c"
                  ,0x1b5,"int Aig_ObjCheckTfi(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((ulong)pOld & 1) == 0) {
    Aig_ManIncrementTravId(p);
    iVar1 = Aig_ObjCheckTfi_rec(p,pNew,pOld);
    return iVar1;
  }
  __assert_fail("!Aig_IsComplement(pOld)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRepr.c"
                ,0x1b6,"int Aig_ObjCheckTfi(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

int Aig_ObjCheckTfi( Aig_Man_t * p, Aig_Obj_t * pNew, Aig_Obj_t * pOld )
{
    assert( !Aig_IsComplement(pNew) );
    assert( !Aig_IsComplement(pOld) );
    Aig_ManIncrementTravId( p );
    return Aig_ObjCheckTfi_rec( p, pNew, pOld );
}